

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::EndDependencyErrors
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this)

{
  ValueType *this_00;
  bool bVar1;
  StringRefType *pSVar2;
  CrtAllocator *allocator;
  ValueType error;
  StringRefType local_28;
  
  this_00 = &this->currentError_;
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ObjectEmpty(this_00);
  if (!bVar1) {
    error.data_.n = (Number)0x0;
    error.data_.s.str = (Ch *)0x3000000000000;
    pSVar2 = GetErrorsString();
    local_28.s = pSVar2->s;
    local_28.length = pSVar2->length;
    allocator = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&error,&local_28,this_00,allocator);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=(this_00,&error);
    AddCurrentError(this,kValidateErrorDependencies,false);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&error);
  }
  return !bVar1;
}

Assistant:

bool EndDependencyErrors() {
        if (currentError_.ObjectEmpty())
            return false;
        ValueType error(kObjectType);
        error.AddMember(GetErrorsString(), currentError_, GetStateAllocator());
        currentError_ = error;
        AddCurrentError(kValidateErrorDependencies);
        return true;
    }